

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

dictionary * dictionary_new(size_t size)

{
  dictionary *pdVar1;
  char **ppcVar2;
  uint *puVar3;
  size_t __nmemb;
  
  pdVar1 = (dictionary *)calloc(1,0x28);
  if (pdVar1 != (dictionary *)0x0) {
    __nmemb = 0x80;
    if (0x80 < size) {
      __nmemb = size;
    }
    pdVar1->size = __nmemb;
    ppcVar2 = (char **)calloc(__nmemb,8);
    pdVar1->val = ppcVar2;
    ppcVar2 = (char **)calloc(__nmemb,8);
    pdVar1->key = ppcVar2;
    puVar3 = (uint *)calloc(__nmemb,4);
    pdVar1->hash = puVar3;
  }
  return pdVar1;
}

Assistant:

dictionary * dictionary_new(size_t size)
{
    dictionary  *   d ;

    /* If no size was specified, allocate space for DICTMINSZ */
    if (size < DICTMINSZ) size = DICTMINSZ ;

    d = (dictionary*) calloc(1, sizeof * d) ;

    if (d) {
        d->size = size ;
        d->val  = (char**) calloc(size, sizeof * d->val);
        d->key  = (char**) calloc(size, sizeof * d->key);
        d->hash = (unsigned*) calloc(size, sizeof * d->hash);
    }
    return d ;
}